

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O2

void __thiscall ev3dev::motor::run_forever(motor *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"run-forever",&local_31);
  set_command(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void run_forever() { set_command("run-forever"); }